

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O2

void __thiscall txpackage_tests::package_cpfp_tests::test_method(package_cpfp_tests *this)

{
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  *pmVar1;
  long lVar2;
  CKey input_signing_key;
  CKey input_signing_key_00;
  CKey input_signing_key_01;
  CKey input_signing_key_02;
  CKey input_signing_key_03;
  CKey input_signing_key_04;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  readonly_property<bool> rVar9;
  bool bVar10;
  Chainstate *pCVar11;
  int64_t iVar12;
  CAmount CVar13;
  int64_t iVar14;
  mapped_type *pmVar15;
  long *plVar16;
  CFeeRate *pCVar17;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *pvVar18;
  const_iterator cVar19;
  const_iterator cVar20;
  long *plVar21;
  CTxMemPool *pCVar22;
  iterator pvVar23;
  iterator pvVar24;
  CKey *pCVar25;
  CMutableTransaction *pCVar26;
  _Base_ptr p_Var27;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  initializer_list<transaction_identifier<true>_> __l;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  initializer_list<transaction_identifier<true>_> __l_00;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  CTransactionRef input_transaction;
  CTransactionRef input_transaction_00;
  CTransactionRef input_transaction_01;
  CTransactionRef input_transaction_02;
  CTransactionRef input_transaction_03;
  CTransactionRef input_transaction_04;
  check_type cVar33;
  size_t *psVar28;
  CMutableTransaction *pCVar29;
  pointer pCVar30;
  char *pcVar31;
  assertion_result *ar;
  undefined4 in_stack_fffffffffffff00c;
  undefined4 uVar32;
  CKey *other;
  undefined8 in_stack_fffffffffffff018;
  undefined8 in_stack_fffffffffffff020;
  CAmount in_stack_fffffffffffff028;
  undefined1 in_stack_fffffffffffff030;
  char *local_fc8;
  char *local_fc0;
  char *local_fb8;
  char *local_fb0;
  undefined1 *local_fa8;
  undefined1 *local_fa0;
  char *local_f98;
  char *local_f90;
  char *local_f88;
  char *local_f80;
  undefined1 *local_f78;
  undefined1 *local_f70;
  char *local_f68;
  char *local_f60;
  char *local_f58;
  char *local_f50;
  undefined1 *local_f48;
  undefined1 *local_f40;
  char *local_f38;
  char *local_f30;
  char *local_f28;
  char *local_f20;
  undefined1 *local_f18;
  undefined1 *local_f10;
  char *local_f08;
  char *local_f00;
  char *local_ef8;
  char *local_ef0;
  undefined1 *local_ee8;
  undefined1 *local_ee0;
  char *local_ed8;
  char *local_ed0;
  char *local_ec8;
  char *local_ec0;
  CFeeRate local_eb8;
  char *local_eb0;
  assertion_result local_ea8;
  undefined1 *local_e90;
  undefined1 *local_e88;
  char *local_e80;
  char *local_e78;
  char *local_e70;
  char *local_e68;
  undefined1 *local_e60;
  undefined1 *local_e58;
  char *local_e50;
  char *local_e48;
  char *local_e40;
  char *local_e38;
  undefined1 *local_e30;
  undefined1 *local_e28;
  char *local_e20;
  char *local_e18;
  char *local_e10;
  char *local_e08;
  undefined1 *local_e00;
  undefined1 *local_df8;
  char *local_df0;
  char *local_de8;
  char *local_de0;
  char *local_dd8;
  undefined1 *local_dd0;
  undefined1 *local_dc8;
  char *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  undefined1 *local_da0;
  undefined1 *local_d98;
  char *local_d90;
  char *local_d88;
  char *local_d80;
  char *local_d78;
  undefined1 *local_d70;
  undefined1 *local_d68;
  char *local_d60;
  char *local_d58;
  CTransactionRef tx_child_poor;
  CKey local_d40;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_d30;
  CTransactionRef tx_parent_rich;
  CKey local_d10;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_d00;
  CAmount high_parent_fee;
  Package package_rich_parent;
  char *local_cc8;
  char *local_cc0;
  undefined1 *local_cb8;
  undefined1 *local_cb0;
  char *local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  undefined1 *local_c88;
  undefined1 *local_c80;
  char *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  undefined1 *local_c58;
  undefined1 *local_c50;
  char *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c30;
  undefined1 *local_c28;
  undefined1 *local_c20;
  char *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  char *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  undefined1 *local_bc8;
  undefined1 *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  char *local_b78;
  char *local_b70;
  undefined1 *local_b68;
  undefined1 *local_b60;
  char *local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  undefined1 *local_b38;
  undefined1 *local_b30;
  char *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  undefined1 *local_b08;
  undefined1 *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  undefined1 *local_ad8;
  undefined1 *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  char *local_ab0;
  undefined1 *local_aa8;
  undefined1 *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  undefined1 *local_a78;
  undefined1 *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  undefined1 *local_a48;
  undefined1 *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  undefined1 *local_a18;
  undefined1 *local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  undefined1 *local_9e8;
  undefined1 *local_9e0;
  char *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  undefined1 *local_9b8;
  undefined1 *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  undefined1 *local_988;
  undefined1 *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  undefined1 *local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  CTransactionRef tx_child_cheap;
  CKey local_898;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_888;
  CMutableTransaction mtx_child_cheap;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  CTransactionRef tx_parent_cheap;
  CKey local_7d0;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_7c0;
  CAmount parent_fee;
  Package package_still_too_low;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  CTransactionRef tx_child;
  CKey local_3f0;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_3e0;
  CMutableTransaction mtx_child;
  CTransactionRef tx_parent;
  CKey local_388;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_378;
  Package package_cpfp;
  CKey grandchild_key;
  CKey child_key;
  size_t expected_pool_size;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock20;
  undefined1 local_310 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_300;
  CFeeRate expected_feerate;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2e0;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  expected_wtxids_1;
  undefined1 local_2b0;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_2a8;
  CMutableTransaction mtx_child_poor;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_250;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_230;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_210;
  CMutableTransaction mtx_parent_cheap;
  PackageMempoolAcceptResult submit_cpfp_deprio;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_140;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_120;
  CMutableTransaction mtx_parent;
  CScript child_spk;
  CMutableTransaction mtx_parent_rich;
  CScript parent_spk;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  TestChain100Setup::mineBlocks((TestChain100Setup *)this,5);
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_mode = 5000;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_result =
       PCKG_RESULT_UNSET;
  TestChain100Setup::MockMempoolMinFee((TestChain100Setup *)this,(CFeeRate *)&submit_cpfp_deprio);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock20,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
             ,0x2df,false);
  expected_pool_size =
       CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                        super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                        mempool._M_t.
                        super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                        super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                        super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  GenerateRandomKey(SUB81(&child_key,0));
  CKey::GetPubKey((CPubKey *)&mtx_parent_rich,&child_key);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&mtx_parent,(CPubKey *)&mtx_parent_rich);
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       CONCAT44(submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason._M_string_length._4_4_,
                mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  submit_cpfp_deprio.m_tx_results._M_t._M_impl._0_1_ = 5;
  GetScriptForDestination(&parent_spk,(CTxDestination *)&submit_cpfp_deprio);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&submit_cpfp_deprio);
  GenerateRandomKey(SUB81(&grandchild_key,0));
  CKey::GetPubKey((CPubKey *)&mtx_parent_rich,&grandchild_key);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&mtx_parent,(CPubKey *)&mtx_parent_rich);
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       CONCAT44(submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason._M_string_length._4_4_,
                mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  submit_cpfp_deprio.m_tx_results._M_t._M_impl._0_1_ = 5;
  GetScriptForDestination(&child_spk,(CTxDestination *)&submit_cpfp_deprio);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&submit_cpfp_deprio);
  package_cpfp.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_cpfp.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package_cpfp.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_378,
             &((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  other = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.coinbaseKey;
  CKey::CKey(&local_388,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_120,&parent_spk.super_CScriptBase);
  input_signing_key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05f138;
  input_signing_key._0_8_ = &local_120;
  auVar3._4_8_ = other;
  auVar3._0_4_ = in_stack_fffffffffffff00c;
  auVar3._12_8_ = in_stack_fffffffffffff018;
  auVar3._20_8_ = in_stack_fffffffffffff020;
  auVar3._28_4_ = 0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_378;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_parent,(TestChain100Setup *)this,input_transaction,0,(int)&local_388,
             input_signing_key,(CScript)(auVar3 << 0x20),in_stack_fffffffffffff028,
             (bool)in_stack_fffffffffffff030);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_120);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_388.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_378._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_parent);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_cpfp,&tx_parent);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3e0,
             &tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_3f0,&child_key);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_140,&child_spk.super_CScriptBase);
  pvVar23 = (iterator)0x65;
  pCVar25 = &local_3f0;
  input_signing_key_00.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101038;
  input_signing_key_00._0_8_ = &local_140;
  auVar4._4_8_ = other;
  auVar4._0_4_ = in_stack_fffffffffffff00c;
  auVar4._12_8_ = in_stack_fffffffffffff018;
  auVar4._20_8_ = in_stack_fffffffffffff020;
  auVar4._28_4_ = 0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_3e0;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_child,(TestChain100Setup *)this,input_transaction_00,0x65,(int)pCVar25,
             input_signing_key_00,(CScript)(auVar4 << 0x20),in_stack_fffffffffffff028,
             (bool)in_stack_fffffffffffff030);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_140);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_3f0.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3e0._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_child);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_cpfp,&tx_child);
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_mode = 0xfa0a1e38;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_result =
       ~PCKG_RESULT_UNSET;
  CTxMemPool::PrioritiseTransaction
            ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,
             &((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->hash).m_wrapped,(CAmount *)&submit_cpfp_deprio);
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = &pCVar25->fCompressed;
  msg.m_begin = pvVar23;
  file.m_end = (iterator)0x2ff;
  file.m_begin = (iterator)&local_410;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_420,msg);
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_01139f30;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_428 = "";
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                                 super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                                 m_node.mempool._M_t.
                                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                 .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  psVar28 = &expected_pool_size;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&submit_cpfp_deprio,&local_430,0x2ff,1,2,&mtx_parent_rich,0xc629c5,psVar28,0xc62ea6);
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar26 = &mtx_parent_rich;
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ProcessNewPackage(&submit_cpfp_deprio,pCVar11,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_cpfp,false,
                    (optional<CFeeRate> *)pCVar26);
  pCVar22 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&mtx_parent_rich,&package_cpfp,&submit_cpfp_deprio,false,pCVar22);
  if ((char)mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish == '\x01') {
    local_440 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_438 = "";
    local_450 = &boost::unit_test::basic_cstring<char_const>::null;
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)pCVar26;
    msg_00.m_begin = (iterator)pCVar22;
    file_00.m_end = (iterator)0x303;
    file_00.m_begin = (iterator)&local_440;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_450,
               msg_00);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((char)mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
      goto LAB_005550e9;
    }
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139e30;
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_460 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_458 = "";
    mtx_parent_cheap.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_parent_rich;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_child_cheap,(lazy_ostream *)&mtx_parent_cheap,1,1,WARN,
               (check_type)psVar28,(size_t)&local_460,0x303);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    local_470 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_468 = "";
    local_480 = &boost::unit_test::basic_cstring<char_const>::null;
    local_478 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = (iterator)pCVar26;
    msg_01.m_begin = (iterator)pCVar22;
    file_01.m_end = (iterator)0x305;
    file_01.m_begin = (iterator)&local_470;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_480,
               msg_01);
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx_parent_cheap.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xc694e1;
    local_490 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_488 = "";
    pCVar26 = &mtx_child_cheap;
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>
                           .m_result);
    pCVar29 = &mtx_child_poor;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,2);
    pvVar23 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (&mtx_parent_cheap,&local_490,0x305,1,2,pCVar26,0xc63af0,pCVar29,0xc62929);
    local_4a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_498 = "";
    local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = (iterator)pCVar26;
    msg_02.m_begin = pvVar23;
    file_02.m_end = (iterator)0x307;
    file_02.m_begin = (iterator)&local_4a0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4b0,
               msg_02);
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx_parent_cheap.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xc694e1;
    local_4c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_4b8 = "";
    pmVar1 = &submit_cpfp_deprio.m_tx_results;
    cVar19 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&pmVar1->_M_t,
                    &((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    pCVar26 = &mtx_child_cheap;
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)((long)&cVar19._M_node[2]._M_parent + 4));
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,10);
    pvVar23 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
              (&mtx_parent_cheap,&local_4c0,0x307,1,2,pCVar26,0xc63b17,pCVar29,0xc63b75);
    local_4d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_4c8 = "";
    local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = (iterator)pCVar26;
    msg_03.m_begin = pvVar23;
    file_03.m_end = (iterator)0x309;
    file_03.m_begin = (iterator)&local_4d0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4e0,
               msg_03);
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx_parent_cheap.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xc694e1;
    local_4f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_4e8 = "";
    cVar19 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&pmVar1->_M_t,
                    &((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    pCVar26 = &mtx_child_cheap;
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)((long)&cVar19._M_node[2]._M_parent + 4));
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,5);
    pvVar23 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
              (&mtx_parent_cheap,&local_4f0,0x309,1,2,pCVar26,0xc63b9b,pCVar29,0xc63004);
    local_500 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_4f8 = "";
    local_510 = &boost::unit_test::basic_cstring<char_const>::null;
    local_508 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = (iterator)pCVar26;
    msg_04.m_begin = pvVar23;
    file_04.m_end = (iterator)0x30a;
    file_04.m_begin = (iterator)&local_500;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_510,
               msg_04);
    cVar19 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&pmVar1->_M_t,
                    &((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    std::__cxx11::string::string
              ((string *)&mtx_parent_cheap,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &cVar19._M_node[2]._M_left);
    bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &mtx_parent_cheap,"min relay fee not met");
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar10);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mtx_child_cheap.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&expected_wtxids_1;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124db06;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc63c8c;
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_520 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_518 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_child_poor,(lazy_ostream *)&mtx_child_cheap,1,0,WARN,
               (check_type)pCVar29,(size_t)&local_520,0x30a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&mtx_parent_cheap);
    local_530 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_528 = "";
    local_540 = &boost::unit_test::basic_cstring<char_const>::null;
    local_538 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = pvVar24;
    msg_05.m_begin = pvVar23;
    file_05.m_end = (iterator)0x30b;
    file_05.m_begin = (iterator)&local_530;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_540,
               msg_05);
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
    mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx_parent_cheap.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xc694e1;
    local_550 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_548 = "";
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).
                                   super_TestChain100Setup.super_TestingSetup.
                                   super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool.
                                   _M_t.
                                   super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                   .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&mtx_parent_cheap,&local_550,0x30b,1,2,&mtx_child_cheap,0xc629c5,&expected_pool_size,
               0xc62ea6);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&mtx_parent_rich);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&submit_cpfp_deprio);
  pvVar23 = (iterator)0x310;
  pvVar24 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&submit_cpfp_deprio,
             &((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup
               .super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
               super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
               super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
               super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs,"m_node.mempool->cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
             ,0x310,false);
  CTxMemPool::ClearPrioritisation
            ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,
             &((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->hash).m_wrapped);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&submit_cpfp_deprio);
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar24;
  msg_06.m_begin = pvVar23;
  file_06.m_end = (iterator)0x315;
  file_06.m_begin = (iterator)&local_560;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_570,
             msg_06);
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_01139f30;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_580 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_578 = "";
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                                 super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                                 m_node.mempool._M_t.
                                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                 .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  psVar28 = &expected_pool_size;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&submit_cpfp_deprio,&local_580,0x315,1,2,&mtx_parent_rich,0xc629c5,psVar28,0xc62ea6);
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar26 = &mtx_parent_rich;
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ProcessNewPackage(&submit_cpfp_deprio,pCVar11,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_cpfp,false,
                    (optional<CFeeRate> *)pCVar26);
  pCVar22 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&mtx_parent_cheap,&package_cpfp,&submit_cpfp_deprio,true,pCVar22);
  if ((char)mtx_parent_cheap.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish == '\x01') {
    local_590 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_588 = "";
    local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_598 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_07.m_end = (iterator)pCVar26;
    msg_07.m_begin = (iterator)pCVar22;
    file_07.m_end = (iterator)0x319;
    file_07.m_begin = (iterator)&local_590;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_5a0,
               msg_07);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((char)mtx_parent_cheap.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
      goto LAB_005550e9;
    }
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139e30;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_5b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_5a8 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = &DAT_00000001;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_parent_cheap;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_child_cheap,(lazy_ostream *)&mtx_parent_rich,1,1,WARN,
               (check_type)psVar28,(size_t)&local_5b0,0x319);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    cVar19 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&submit_cpfp_deprio.m_tx_results._M_t,
                    &((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    cVar20 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&submit_cpfp_deprio.m_tx_results._M_t,
                    &((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    local_5c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_5b8 = "";
    local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_08.m_end = (iterator)pCVar26;
    msg_08.m_begin = (iterator)pCVar22;
    file_08.m_end = (iterator)0x31d;
    file_08.m_begin = (iterator)&local_5c0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_5d0,
               msg_08);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           cVar19._M_node[2]._M_color == _S_red);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124db21;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xc63cd6;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_5e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_5d8 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_child_poor;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_child_cheap,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)psVar28,(size_t)&local_5e0,0x31d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_5f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_5e8 = "";
    local_600 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_09.m_end = pvVar24;
    msg_09.m_begin = pvVar23;
    file_09.m_end = (iterator)0x31e;
    file_09.m_begin = (iterator)&local_5f0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_600,
               msg_09);
    plVar16 = std::optional<long>::value((optional<long> *)&cVar19._M_node[5]._M_right);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,*plVar16 == 200);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124db2e;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xc63d1d;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_610 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_608 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_child_poor;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_child_cheap,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)psVar28,(size_t)&local_610,0x31e);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_620 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_618 = "";
    local_630 = &boost::unit_test::basic_cstring<char_const>::null;
    local_628 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_10.m_end = pvVar24;
    msg_10.m_begin = pvVar23;
    file_10.m_end = (iterator)0x31f;
    file_10.m_begin = (iterator)&local_620;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_630,
               msg_10);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           cVar20._M_node[2]._M_color == _S_red);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124da26;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xc63980;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_640 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_638 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_child_poor;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_child_cheap,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)psVar28,(size_t)&local_640,799);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_650 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_648 = "";
    local_660 = &boost::unit_test::basic_cstring<char_const>::null;
    local_658 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_11.m_end = pvVar24;
    msg_11.m_begin = pvVar23;
    file_11.m_end = (iterator)0x320;
    file_11.m_begin = (iterator)&local_650;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_660,
               msg_11);
    plVar16 = std::optional<long>::value((optional<long> *)&cVar20._M_node[5]._M_right);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,*plVar16 == 100000000);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124db49;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xc63d4a;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_670 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_668 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_child_poor;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_child_cheap,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)psVar28,(size_t)&local_670,800);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x5f5e1c8;
    iVar12 = GetVirtualTransactionSize
                       (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    iVar14 = GetVirtualTransactionSize
                       (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    CFeeRate::CFeeRate(&expected_feerate,(CAmount *)&mtx_parent_rich,(int)iVar14 + (int)iVar12);
    local_680 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_678 = "";
    local_690 = &boost::unit_test::basic_cstring<char_const>::null;
    local_688 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_12.m_end = pvVar24;
    msg_12.m_begin = pvVar23;
    file_12.m_end = (iterator)0x324;
    file_12.m_begin = (iterator)&local_680;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_690,
               msg_12);
    pCVar17 = std::optional<CFeeRate>::value((optional<CFeeRate> *)&cVar19._M_node[6]._M_parent);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           pCVar17->nSatoshisPerK == expected_feerate.nSatoshisPerK);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124db56;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xc63d8c;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_6a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_698 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_child_poor;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_child_cheap,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)psVar28,(size_t)&local_6a0,0x324);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_6b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6a8 = "";
    local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_13.m_end = pvVar24;
    msg_13.m_begin = pvVar23;
    file_13.m_end = (iterator)0x325;
    file_13.m_begin = (iterator)&local_6b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_6c0,
               msg_13);
    pCVar17 = std::optional<CFeeRate>::value((optional<CFeeRate> *)&cVar20._M_node[6]._M_parent);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           pCVar17->nSatoshisPerK == expected_feerate.nSatoshisPerK);
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124da68;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xc63a4e;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_6d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6c8 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_child_poor;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_child_cheap,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)psVar28,(size_t)&local_6d0,0x325);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         *(pointer *)
          ((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         *(pointer *)
          (((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         *(pointer *)
          (((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start =
         *(pointer *)
          (((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_finish =
         *(pointer *)
          ((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         *(pointer *)
          (((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    mtx_parent_rich._48_8_ =
         *(undefined8 *)
          (((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    __l._M_len = 2;
    __l._M_array = (iterator)&mtx_parent_rich;
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
           &mtx_child_cheap,__l,(allocator_type *)&mtx_child_poor);
    local_6e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6d8 = "";
    local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_14.m_end = pvVar24;
    msg_14.m_begin = pvVar23;
    file_14.m_end = (iterator)0x327;
    file_14.m_begin = (iterator)&local_6e0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_6f0,
               msg_14);
    pvVar18 = std::
              optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                       *)&cVar19._M_node[6]._M_right);
    bVar10 = std::operator==(pvVar18,(vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                      *)&mtx_child_cheap);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar10);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124db71;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc63dd3;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_700 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6f8 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&expected_wtxids_1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_child_poor,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)psVar28,(size_t)&local_700,0x327);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_710 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_708 = "";
    local_720 = &boost::unit_test::basic_cstring<char_const>::null;
    local_718 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_15.m_end = pvVar24;
    msg_15.m_begin = pvVar23;
    file_15.m_end = (iterator)0x328;
    file_15.m_begin = (iterator)&local_710;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_720,
               msg_15);
    pvVar18 = std::
              optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                       *)&cVar20._M_node[6]._M_right);
    bVar10 = std::operator==(pvVar18,(vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                      *)&mtx_child_cheap);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar10);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124da90;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc63adc;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_730 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_728 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&expected_wtxids_1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_child_poor,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)psVar28,(size_t)&local_730,0x328);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_740 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_738 = "";
    local_750 = &boost::unit_test::basic_cstring<char_const>::null;
    local_748 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_16.m_end = pvVar24;
    msg_16.m_begin = pvVar23;
    file_16.m_end = (iterator)0x329;
    file_16.m_begin = (iterator)&local_740;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_750,
               msg_16);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           1000 < expected_feerate.nSatoshisPerK);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124db7e;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc63df8;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_760 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_758 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&expected_wtxids_1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_child_poor,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)psVar28,(size_t)&local_760,0x329);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ::~_Vector_base((_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     *)&mtx_child_cheap);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&mtx_parent_cheap);
  expected_pool_size = expected_pool_size + 2;
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_768 = "";
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar24;
  msg_17.m_begin = pvVar23;
  file_17.m_end = (iterator)0x32c;
  file_17.m_begin = (iterator)&local_770;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_780,
             msg_17);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_790 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_788 = "";
  mtx_parent_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                                 super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                                 m_node.mempool._M_t.
                                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                 .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  uVar32 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&mtx_parent_rich,&local_790,0x32c);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&submit_cpfp_deprio);
  package_still_too_low.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  package_still_too_low.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_still_too_low.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parent_fee = 200;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7c0,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_7d0,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_210,&parent_spk.super_CScriptBase);
  _cVar33 = 0x12a05f138;
  pCVar25 = &local_7d0;
  pvVar23 = (iterator)0x0;
  input_signing_key_01.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05f138;
  input_signing_key_01._0_8_ = &local_210;
  auVar5._4_8_ = other;
  auVar5._0_4_ = uVar32;
  auVar5._12_8_ = in_stack_fffffffffffff018;
  auVar5._20_8_ = in_stack_fffffffffffff020;
  auVar5._28_4_ = 0;
  input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_7c0;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_parent_cheap,(TestChain100Setup *)this,input_transaction_01,0,(int)pCVar25,
             input_signing_key_01,(CScript)(auVar5 << 0x20),in_stack_fffffffffffff028,
             (bool)in_stack_fffffffffffff030);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_210);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_7d0.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7c0._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_parent_cheap)
  ;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_still_too_low,&tx_parent_cheap);
  local_7f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7e8 = "";
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = &pCVar25->fCompressed;
  msg_18.m_begin = pvVar23;
  file_18.m_end = (iterator)0x33b;
  file_18.m_begin = (iterator)&local_7f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_800,
             msg_18);
  mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CTxMemPool::GetMinFee
                          ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                           super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node
                           .mempool._M_t.
                           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  iVar12 = GetVirtualTransactionSize
                     (tx_parent_cheap.
                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  CVar13 = CFeeRate::GetFee((CFeeRate *)&mtx_child_poor,(uint32_t)iVar12);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,200 < CVar13);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124db8b;
  mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc63e55;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_0113a070;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_808 = "";
  pvVar23 = &DAT_00000001;
  pvVar24 = (iterator)0x0;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&mtx_child_cheap;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mtx_parent_rich,(lazy_ostream *)&submit_cpfp_deprio,1,0,WARN,
             _cVar33,(size_t)&local_810,0x33b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_820 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_818 = "";
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar24;
  msg_19.m_begin = pvVar23;
  file_19.m_end = (iterator)0x33c;
  file_19.m_begin = (iterator)&local_820;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_830,
             msg_19);
  pCVar22 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  iVar12 = GetVirtualTransactionSize
                     (tx_parent_cheap.
                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  CVar13 = CFeeRate::GetFee(&(pCVar22->m_opts).min_relay_feerate,(uint32_t)iVar12);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,CVar13 < 0xc9);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124db98;
  mtx_child_cheap.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc63ec0;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_0113a070;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_838 = "";
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&mtx_child_cheap;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mtx_parent_rich,(lazy_ostream *)&submit_cpfp_deprio,1,0,WARN,
             _cVar33,(size_t)&local_840,0x33c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_888,
             &tx_parent_cheap.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_898,&child_key);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_230,&child_spk.super_CScriptBase);
  _cVar33 = 0x12a05eee0;
  pvVar23 = (iterator)0x65;
  pCVar25 = &local_898;
  input_signing_key_02.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05eee0;
  input_signing_key_02._0_8_ = &local_230;
  auVar6._4_8_ = other;
  auVar6._0_4_ = uVar32;
  auVar6._12_8_ = in_stack_fffffffffffff018;
  auVar6._20_8_ = in_stack_fffffffffffff020;
  auVar6._28_4_ = 0;
  input_transaction_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_888;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_child_cheap,(TestChain100Setup *)this,input_transaction_02,0x65,(int)pCVar25,
             input_signing_key_02,(CScript)(auVar6 << 0x20),in_stack_fffffffffffff028,
             (bool)in_stack_fffffffffffff030);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_230);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_898.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_888._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_child_cheap);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_still_too_low,&tx_child_cheap);
  local_8b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8b0 = "";
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = &pCVar25->fCompressed;
  msg_20.m_begin = pvVar23;
  file_20.m_end = (iterator)0x344;
  file_20.m_begin = (iterator)&local_8b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_8c8,
             msg_20);
  expected_wtxids_1.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CTxMemPool::GetMinFee
                          ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                           super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node
                           .mempool._M_t.
                           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  iVar12 = GetVirtualTransactionSize
                     (tx_child_cheap.
                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  CVar13 = CFeeRate::GetFee((CFeeRate *)&expected_wtxids_1,(uint32_t)iVar12);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,CVar13 < 0x259);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124dbb3;
  mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc63f1c;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_0113a070;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_8d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8d0 = "";
  pvVar23 = &DAT_00000001;
  pvVar24 = (iterator)0x0;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&mtx_child_poor;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mtx_parent_rich,(lazy_ostream *)&submit_cpfp_deprio,1,0,WARN,
             _cVar33,(size_t)&local_8d8,0x344);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_8e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8e0 = "";
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = pvVar24;
  msg_21.m_begin = pvVar23;
  file_21.m_end = (iterator)0x345;
  file_21.m_begin = (iterator)&local_8e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_8f8,
             msg_21);
  expected_wtxids_1.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CTxMemPool::GetMinFee
                          ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                           super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node
                           .mempool._M_t.
                           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  iVar12 = GetVirtualTransactionSize
                     (tx_parent_cheap.
                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar14 = GetVirtualTransactionSize
                     (tx_child_cheap.
                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  CVar13 = CFeeRate::GetFee((CFeeRate *)&expected_wtxids_1,(int)iVar14 + (int)iVar12);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,800 < CVar13);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124dbce;
  mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc63fb2;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_0113a070;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_908 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_900 = "";
  pvVar23 = &DAT_00000001;
  pvVar24 = (iterator)0x0;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&mtx_child_poor;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mtx_parent_rich,(lazy_ostream *)&submit_cpfp_deprio,1,0,WARN,
             _cVar33,(size_t)&local_908,0x345);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_918 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_910 = "";
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar24;
  msg_22.m_begin = pvVar23;
  file_22.m_end = (iterator)0x346;
  file_22.m_begin = (iterator)&local_918;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_928,
             msg_22);
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_01139f30;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_938 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_930 = "";
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                                 super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                                 m_node.mempool._M_t.
                                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                 .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  psVar28 = &expected_pool_size;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&submit_cpfp_deprio,&local_938,0x346,1,2,&mtx_parent_rich,0xc629c5,psVar28,0xc62ea6);
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar26 = &mtx_parent_rich;
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ProcessNewPackage(&submit_cpfp_deprio,pCVar11,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_still_too_low,
                    false,(optional<CFeeRate> *)pCVar26);
  pCVar22 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&mtx_parent_rich,&package_still_too_low,&submit_cpfp_deprio,false,pCVar22);
  if ((char)mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish == '\x01') {
    local_948 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_940 = "";
    local_958 = &boost::unit_test::basic_cstring<char_const>::null;
    local_950 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_23.m_end = (iterator)pCVar26;
    msg_23.m_begin = (iterator)pCVar22;
    file_23.m_end = (iterator)0x34d;
    file_23.m_begin = (iterator)&local_948;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_958,
               msg_23);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)expected_wtxids_1.
                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((char)mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
      goto LAB_005550e9;
    }
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139e30;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_968 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_960 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = &DAT_00000001;
    mtx_child_poor.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_parent_rich;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids_1,(lazy_ostream *)&mtx_child_poor,1,1,WARN,
               (check_type)psVar28,(size_t)&local_968,0x34d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    local_978 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_970 = "";
    local_988 = &boost::unit_test::basic_cstring<char_const>::null;
    local_980 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_24.m_end = (iterator)pCVar26;
    msg_24.m_begin = (iterator)pCVar22;
    file_24.m_end = (iterator)0x351;
    file_24.m_begin = (iterator)&local_978;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_988,
               msg_24);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx_child_poor.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xc694e1;
    local_998 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_990 = "";
    pmVar1 = &submit_cpfp_deprio.m_tx_results;
    pmVar15 = std::
              map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              ::at(pmVar1,&((tx_parent_cheap.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped);
    pvVar18 = &expected_wtxids_1;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(expected_wtxids_1.
                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (pmVar15->m_state).super_ValidationState<TxValidationResult>.m_result);
    expected_feerate.nSatoshisPerK._0_4_ = 0xc;
    pvVar23 = (iterator)0x2;
    pCVar30 = (pointer)&expected_feerate;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
              (&mtx_child_poor,&local_998,0x351,1,2,pvVar18,0xc63fb3,(pointer)&expected_feerate,
               0xc64011);
    local_9a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_9a0 = "";
    local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_25.m_end = (iterator)pvVar18;
    msg_25.m_begin = pvVar23;
    file_25.m_end = (iterator)0x353;
    file_25.m_begin = (iterator)&local_9a8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_9b8,
               msg_25);
    pmVar15 = std::
              map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              ::at(pmVar1,&((tx_parent_cheap.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped);
    pCVar17 = std::optional<CFeeRate>::value(&pmVar15->m_effective_feerate);
    iVar12 = GetVirtualTransactionSize
                       (tx_parent_cheap.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    CFeeRate::CFeeRate((CFeeRate *)local_310,&parent_fee,(uint32_t)iVar12);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(expected_wtxids_1.
                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                           (undefined **)pCVar17->nSatoshisPerK == (undefined **)local_310._0_8_);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expected_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_124dc03;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_9c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_9c0 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_child_poor.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&expected_feerate;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids_1,(lazy_ostream *)&mtx_child_poor,1,0,WARN,
               (check_type)pCVar30,(size_t)&local_9c8,0x353);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_9d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_9d0 = "";
    local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_26.m_end = pvVar24;
    msg_26.m_begin = pvVar23;
    file_26.m_end = (iterator)0x356;
    file_26.m_begin = (iterator)&local_9d8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_9e8,
               msg_26);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx_child_poor.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xc694e1;
    local_9f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_9f0 = "";
    pmVar15 = std::
              map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              ::at(pmVar1,&((tx_child_cheap.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped);
    pvVar18 = &expected_wtxids_1;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(expected_wtxids_1.
                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (pmVar15->m_state).super_ValidationState<TxValidationResult>.m_result);
    expected_feerate.nSatoshisPerK._0_4_ = 0xc;
    pvVar23 = (iterator)0x2;
    pCVar30 = (pointer)&expected_feerate;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
              (&mtx_child_poor,&local_9f8,0x356,1,2,pvVar18,0xc640e2,(pointer)&expected_feerate,
               0xc64011);
    local_a08 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_a00 = "";
    local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_27.m_end = (iterator)pvVar18;
    msg_27.m_begin = pvVar23;
    file_27.m_end = (iterator)0x358;
    file_27.m_begin = (iterator)&local_a08;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_a18,
               msg_27);
    pmVar15 = std::
              map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              ::at(pmVar1,&((tx_child_cheap.
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_witness_hash).m_wrapped);
    pCVar17 = std::optional<CFeeRate>::value(&pmVar15->m_effective_feerate);
    package_rich_parent.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x320;
    iVar12 = GetVirtualTransactionSize
                       (tx_parent_cheap.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar14 = GetVirtualTransactionSize
                       (tx_child_cheap.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    CFeeRate::CFeeRate((CFeeRate *)local_310,(CAmount *)&package_rich_parent,
                       (int)iVar14 + (int)iVar12);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(expected_wtxids_1.
                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                           (undefined **)pCVar17->nSatoshisPerK == (undefined **)local_310._0_8_);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expected_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_124dc2b;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_a28 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_a20 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_child_poor.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&expected_feerate;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids_1,(lazy_ostream *)&mtx_child_poor,1,0,WARN,
               (check_type)pCVar30,(size_t)&local_a28,0x358);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&mtx_parent_rich);
  local_a38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_a30 = "";
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = pvVar24;
  msg_28.m_begin = pvVar23;
  file_28.m_end = (iterator)0x35a;
  file_28.m_begin = (iterator)&local_a38;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_a48,
             msg_28);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_a58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_a50 = "";
  pCVar26 = &mtx_child_poor;
  mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.
                         m_result);
  expected_wtxids_1.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expected_wtxids_1.
                         super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  pvVar23 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
            (&mtx_parent_rich,&local_a58,0x35a,1,2,pCVar26,0xc64222,&expected_wtxids_1,0xc62929);
  local_a68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_a60 = "";
  local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a70 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_29.m_end = (iterator)pCVar26;
  msg_29.m_begin = pvVar23;
  file_29.m_end = (iterator)0x35b;
  file_29.m_begin = (iterator)&local_a68;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_a78,
             msg_29);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_a88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_a80 = "";
  std::__cxx11::string::string
            ((string *)&mtx_child_poor,
             &submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason);
  pvVar23 = (iterator)0x2;
  pCVar26 = &mtx_child_poor;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
            (&mtx_parent_rich,&local_a88,0x35b,1,2,pCVar26,0xc6424d,"transaction failed",0xc62978);
  std::__cxx11::string::~string((string *)&mtx_child_poor);
  local_a98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_a90 = "";
  local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_aa0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_30.m_end = (iterator)pCVar26;
  msg_30.m_begin = pvVar23;
  file_30.m_end = (iterator)0x35c;
  file_30.m_begin = (iterator)&local_a98;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_aa8,
             msg_30);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_ab8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_ab0 = "";
  mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                                 super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                                 m_node.mempool._M_t.
                                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                 .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  psVar28 = &expected_pool_size;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&mtx_parent_rich,&local_ab8,0x35c,1,2,&mtx_child_poor,0xc629c5,psVar28,0xc62ea6);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&submit_cpfp_deprio);
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_mode = 100000000;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_result =
       PCKG_RESULT_UNSET;
  CTxMemPool::PrioritiseTransaction
            ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,
             &((tx_child_cheap.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->hash).m_wrapped,(CAmount *)&submit_cpfp_deprio);
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar26 = &mtx_parent_rich;
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ProcessNewPackage(&submit_cpfp_deprio,pCVar11,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_still_too_low,
                    false,(optional<CFeeRate> *)pCVar26);
  pCVar22 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&mtx_child_poor,&package_still_too_low,&submit_cpfp_deprio,true,pCVar22);
  if ((char)mtx_child_poor.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish == '\x01') {
    local_ac8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_ac0 = "";
    local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_31.m_end = (iterator)pCVar26;
    msg_31.m_begin = (iterator)pCVar22;
    file_31.m_end = (iterator)0x367;
    file_31.m_begin = (iterator)&local_ac8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_ad8,
               msg_31);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)expected_wtxids_1.
                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((char)mtx_child_poor.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
      goto LAB_005550e9;
    }
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139e30;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_ae8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_ae0 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = &DAT_00000001;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_child_poor;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids_1,(lazy_ostream *)&mtx_parent_rich,1,1,WARN,
               (check_type)psVar28,(size_t)&local_ae8,0x367);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x5f5e420;
    iVar12 = GetVirtualTransactionSize
                       (tx_parent_cheap.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar14 = GetVirtualTransactionSize
                       (tx_child_cheap.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    CFeeRate::CFeeRate((CFeeRate *)&package_rich_parent,(CAmount *)&mtx_parent_rich,
                       (int)iVar14 + (int)iVar12);
    local_af8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_af0 = "";
    local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_32.m_end = (iterator)pCVar26;
    msg_32.m_begin = (iterator)pCVar22;
    file_32.m_end = (iterator)0x36b;
    file_32.m_begin = (iterator)&local_af8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_b08,
               msg_32);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xc694e1;
    local_b18 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_b10 = "";
    pvVar18 = &expected_wtxids_1;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)submit_cpfp_deprio.m_tx_results._M_t._M_impl.super__Rb_tree_header._M_node_count;
    expected_feerate.nSatoshisPerK =
         (long)package_still_too_low.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)package_still_too_low.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4;
    pvVar23 = (iterator)0x2;
    pCVar30 = (pointer)&expected_feerate;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&mtx_parent_rich,&local_b18,0x36b,1,2,pvVar18,0xc6427e,(pointer)&expected_feerate,
               0xc642ad);
    cVar19 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&submit_cpfp_deprio.m_tx_results._M_t,
                    &((tx_parent_cheap.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_witness_hash).m_wrapped);
    cVar20 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&submit_cpfp_deprio.m_tx_results._M_t,
                    &((tx_child_cheap.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_witness_hash).m_wrapped);
    local_b28 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_b20 = "";
    local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_33.m_end = (iterator)pvVar18;
    msg_33.m_begin = pvVar23;
    file_33.m_end = (iterator)0x36e;
    file_33.m_begin = (iterator)&local_b28;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_b38,
               msg_33);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(expected_wtxids_1.
                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                           cVar19._M_node[2]._M_color == _S_red);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expected_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_124db21;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_b48 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_b40 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&expected_feerate;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids_1,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)pCVar30,(size_t)&local_b48,0x36e);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_b58 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_b50 = "";
    local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_34.m_end = pvVar24;
    msg_34.m_begin = pvVar23;
    file_34.m_end = (iterator)0x36f;
    file_34.m_begin = (iterator)&local_b58;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_b68,
               msg_34);
    plVar16 = std::optional<long>::value((optional<long> *)&cVar19._M_node[5]._M_right);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(expected_wtxids_1.
                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,*plVar16 == 200);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expected_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_124dc96;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_b78 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_b70 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&expected_feerate;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids_1,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)pCVar30,(size_t)&local_b78,0x36f);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_b88 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_b80 = "";
    local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_35.m_end = pvVar24;
    msg_35.m_begin = pvVar23;
    file_35.m_end = (iterator)0x370;
    file_35.m_begin = (iterator)&local_b88;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_b98,
               msg_35);
    pCVar17 = std::optional<CFeeRate>::value((optional<CFeeRate> *)&cVar19._M_node[6]._M_parent);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(expected_wtxids_1.
                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                           (pointer)pCVar17->nSatoshisPerK ==
                           package_rich_parent.
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expected_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_124db56;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_ba8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_ba0 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&expected_feerate;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids_1,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)pCVar30,(size_t)&local_ba8,0x370);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_bb8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_bb0 = "";
    local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_36.m_end = pvVar24;
    msg_36.m_begin = pvVar23;
    file_36.m_end = (iterator)0x371;
    file_36.m_begin = (iterator)&local_bb8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_bc8,
               msg_36);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(expected_wtxids_1.
                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                           cVar20._M_node[2]._M_color == _S_red);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expected_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_124da26;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_bd8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_bd0 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&expected_feerate;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids_1,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)pCVar30,(size_t)&local_bd8,0x371);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_be8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_be0 = "";
    local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_37.m_end = pvVar24;
    msg_37.m_begin = pvVar23;
    file_37.m_end = (iterator)0x372;
    file_37.m_begin = (iterator)&local_be8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_bf8,
               msg_37);
    plVar16 = std::optional<long>::value((optional<long> *)&cVar20._M_node[5]._M_right);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(expected_wtxids_1.
                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,*plVar16 == 600);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expected_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_124dca3;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_c08 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c00 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&expected_feerate;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids_1,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)pCVar30,(size_t)&local_c08,0x372);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_c18 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c10 = "";
    local_c28 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_38.m_end = pvVar24;
    msg_38.m_begin = pvVar23;
    file_38.m_end = (iterator)0x373;
    file_38.m_begin = (iterator)&local_c18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_c28,
               msg_38);
    pCVar17 = std::optional<CFeeRate>::value((optional<CFeeRate> *)&cVar20._M_node[6]._M_parent);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(expected_wtxids_1.
                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                           (pointer)pCVar17->nSatoshisPerK ==
                           package_rich_parent.
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids_1.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expected_feerate.nSatoshisPerK = (CAmount)anon_var_dwarf_124da68;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_c38 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c30 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&expected_feerate;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids_1,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)pCVar30,(size_t)&local_c38,0x373);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         *(pointer *)
          ((tx_parent_cheap.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         *(pointer *)
          (((tx_parent_cheap.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         *(pointer *)
          (((tx_parent_cheap.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start =
         *(pointer *)
          (((tx_parent_cheap.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_finish =
         *(pointer *)
          ((tx_child_cheap.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         *(pointer *)
          (((tx_child_cheap.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    mtx_parent_rich._48_8_ =
         *(undefined8 *)
          (((tx_child_cheap.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&mtx_parent_rich;
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    vector(&expected_wtxids_1,__l_00,(allocator_type *)&expected_feerate);
    local_c48 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c40 = "";
    local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_39.m_end = pvVar24;
    msg_39.m_begin = pvVar23;
    file_39.m_end = (iterator)0x375;
    file_39.m_begin = (iterator)&local_c48;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_c58,
               msg_39);
    pvVar18 = std::
              optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                       *)&cVar19._M_node[6]._M_right);
    bVar10 = std::operator==(pvVar18,&expected_wtxids_1);
    expected_feerate.nSatoshisPerK._0_1_ = bVar10;
    aStack_2e0._M_allocated_capacity = 0;
    local_310._0_8_ = "it_parent->second.m_wtxids_fee_calculations.value() == expected_wtxids";
    local_310._8_8_ = "";
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_c68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c60 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_310;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_feerate,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)pCVar30,(size_t)&local_c68,0x375);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e0);
    local_c78 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c70 = "";
    local_c88 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c80 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_40.m_end = pvVar24;
    msg_40.m_begin = pvVar23;
    file_40.m_end = (iterator)0x376;
    file_40.m_begin = (iterator)&local_c78;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_c88,
               msg_40);
    pvVar18 = std::
              optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                       *)&cVar20._M_node[6]._M_right);
    bVar10 = std::operator==(pvVar18,&expected_wtxids_1);
    expected_feerate.nSatoshisPerK._0_1_ = bVar10;
    aStack_2e0._M_allocated_capacity = 0;
    local_310._0_8_ = "it_child->second.m_wtxids_fee_calculations.value() == expected_wtxids";
    local_310._8_8_ = "";
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_c98 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c90 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_310;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_feerate,(lazy_ostream *)&mtx_parent_rich,1,0,WARN,
               (check_type)pCVar30,(size_t)&local_c98,0x376);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e0);
    std::_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ::~_Vector_base(&expected_wtxids_1.
                     super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   );
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&mtx_child_poor);
  expected_pool_size = expected_pool_size + 2;
  local_ca8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_ca0 = "";
  local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_41.m_end = pvVar24;
  msg_41.m_begin = pvVar23;
  file_41.m_end = (iterator)0x379;
  file_41.m_begin = (iterator)&local_ca8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_cb8,
             msg_41);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  mtx_parent_rich.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent_rich.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc694e1;
  local_cc8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_cc0 = "";
  mtx_child_poor.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                                 super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                                 m_node.mempool._M_t.
                                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                 .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  uVar32 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&mtx_parent_rich,&local_cc8,0x379);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&submit_cpfp_deprio);
  package_rich_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  package_rich_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_rich_parent.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  high_parent_fee = 100000000;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d00,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_d10,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_250,&parent_spk.super_CScriptBase);
  input_signing_key_03.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key_03._0_8_ = &local_250;
  auVar7._4_8_ = other;
  auVar7._0_4_ = uVar32;
  auVar7._12_8_ = in_stack_fffffffffffff018;
  auVar7._20_8_ = in_stack_fffffffffffff020;
  auVar7._28_4_ = 0;
  input_transaction_03.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_03.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_d00;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_parent_rich,(TestChain100Setup *)this,input_transaction_03,0,(int)&local_d10,
             input_signing_key_03,(CScript)(auVar7 << 0x20),in_stack_fffffffffffff028,
             (bool)in_stack_fffffffffffff030);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_250);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_d10.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d00._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_parent_rich);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_rich_parent,&tx_parent_rich);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d30,
             &tx_parent_rich.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_d40,&child_key);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_2a8,&child_spk.super_CScriptBase);
  pvVar23 = (iterator)0x65;
  pCVar25 = &local_d40;
  input_signing_key_04.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key_04._0_8_ = &local_2a8;
  auVar8._4_8_ = other;
  auVar8._0_4_ = uVar32;
  auVar8._12_8_ = in_stack_fffffffffffff018;
  auVar8._20_8_ = in_stack_fffffffffffff020;
  auVar8._28_4_ = 0;
  input_transaction_04.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_04.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_d30;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_child_poor,(TestChain100Setup *)this,input_transaction_04,0x65,(int)pCVar25,
             input_signing_key_04,(CScript)(auVar8 << 0x20),in_stack_fffffffffffff028,
             (bool)in_stack_fffffffffffff030);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_2a8);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_d40.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d30._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx_child_poor);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_rich_parent,&tx_child_poor);
  local_d60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_d58 = "";
  local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d68 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_42.m_end = &pCVar25->fCompressed;
  msg_42.m_begin = pvVar23;
  file_42.m_end = (iterator)0x393;
  file_42.m_begin = (iterator)&local_d60;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_d70,
             msg_42);
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_01139f30;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_d80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_d78 = "";
  expected_wtxids_1.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                                 super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                                 m_node.mempool._M_t.
                                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                 .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  psVar28 = &expected_pool_size;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&submit_cpfp_deprio,&local_d80,0x393,1,2,&expected_wtxids_1,0xc629c5,psVar28,0xc62ea6);
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pvVar18 = &expected_wtxids_1;
  expected_wtxids_1.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)expected_wtxids_1.
                        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ProcessNewPackage(&submit_cpfp_deprio,pCVar11,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_rich_parent,
                    false,(optional<CFeeRate> *)pvVar18);
  pCVar22 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&expected_wtxids_1,&package_rich_parent,&submit_cpfp_deprio,false,pCVar22);
  if (local_2b0 == '\x01') {
    local_d90 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_d88 = "";
    local_da0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_43.m_end = (iterator)pvVar18;
    msg_43.m_begin = (iterator)pCVar22;
    file_43.m_end = (iterator)0x397;
    file_43.m_begin = (iterator)&local_d90;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_da0,
               msg_43);
    local_310._0_8_ = local_310._0_8_ & 0xffffffffffffff00;
    local_310._8_8_ = (char *)0x0;
    aStack_300._M_allocated_capacity = 0;
    expected_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_01139e30;
    aStack_2e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_db0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_da8 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = &DAT_00000001;
    aStack_2e0._8_8_ =
         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&expected_wtxids_1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_310,(lazy_ostream *)&expected_feerate,1,1,WARN,
               (check_type)psVar28,(size_t)&local_db0,0x397);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_300._M_allocated_capacity);
  }
  else {
    local_dc0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_db8 = "";
    local_dd0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_dc8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_44.m_end = (iterator)pvVar18;
    msg_44.m_begin = (iterator)pCVar22;
    file_44.m_end = (iterator)0x39a;
    file_44.m_begin = (iterator)&local_dc0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_dd0,
               msg_44);
    expected_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_01139f30;
    aStack_2e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_2e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_de0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_dd8 = "";
    pvVar23 = local_310;
    local_310._0_4_ =
         submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.m_result;
    local_ea8._0_4_ = 2;
    pvVar24 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (&expected_feerate,&local_de0,0x39a,1,2,pvVar23,0xc64330,&local_ea8,0xc62929);
    local_df0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_de8 = "";
    local_e00 = &boost::unit_test::basic_cstring<char_const>::null;
    local_df8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_45.m_end = pvVar23;
    msg_45.m_begin = pvVar24;
    file_45.m_end = (iterator)0x39b;
    file_45.m_begin = (iterator)&local_df0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_e00,
               msg_45);
    expected_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_01139f30;
    aStack_2e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_2e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_e10 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_e08 = "";
    std::__cxx11::string::string
              ((string *)local_310,
               &submit_cpfp_deprio.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason);
    pcVar31 = "transaction failed";
    pvVar24 = (iterator)0x2;
    pvVar23 = local_310;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
              (&expected_feerate,&local_e10,0x39b,1,2,pvVar23,0xc64357,"transaction failed",0xc62978
              );
    std::__cxx11::string::~string((string *)local_310);
    cVar19 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&submit_cpfp_deprio.m_tx_results._M_t,
                    &((tx_parent_rich.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_witness_hash).m_wrapped);
    cVar20 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&submit_cpfp_deprio.m_tx_results._M_t,
                    &((tx_child_poor.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_witness_hash).m_wrapped);
    local_e20 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_e18 = "";
    local_e30 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e28 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_46.m_end = pvVar23;
    msg_46.m_begin = pvVar24;
    file_46.m_end = (iterator)0x39f;
    file_46.m_begin = (iterator)&local_e20;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_e30,
               msg_46);
    local_310._8_8_ = (char *)0x0;
    aStack_300._M_allocated_capacity = 0;
    local_ea8._0_8_ = "it_parent->second.m_result_type == MempoolAcceptResult::ResultType::VALID";
    local_ea8.m_message.px = (element_type *)0xc63cd6;
    expected_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_0113a070;
    aStack_2e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_e40 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_e38 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    aStack_2e0._8_8_ = &local_ea8;
    local_310[0] = (class_property<bool>)
                   (class_property<bool>)(cVar19._M_node[2]._M_color == _S_red);
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_310,(lazy_ostream *)&expected_feerate,1,0,WARN,
               (check_type)pcVar31,(size_t)&local_e40,0x39f);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_300._M_allocated_capacity);
    local_e50 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_e48 = "";
    local_e60 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e58 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_47.m_end = pvVar24;
    msg_47.m_begin = pvVar23;
    file_47.m_end = (iterator)0x3a0;
    file_47.m_begin = (iterator)&local_e50;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_e60,
               msg_47);
    local_310[0] = (class_property<bool>)
                   (class_property<bool>)(cVar20._M_node[2]._M_color == _S_black);
    local_310._8_8_ = (char *)0x0;
    aStack_300._M_allocated_capacity = 0;
    local_ea8._0_8_ = "it_child->second.m_result_type == MempoolAcceptResult::ResultType::INVALID";
    local_ea8.m_message.px = (element_type *)0xc643ce;
    expected_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_0113a070;
    aStack_2e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_e70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_e68 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    aStack_2e0._8_8_ = &local_ea8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_310,(lazy_ostream *)&expected_feerate,1,0,WARN,
               (check_type)pcVar31,(size_t)&local_e70,0x3a0);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_300._M_allocated_capacity);
    local_e80 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_e78 = "";
    local_e90 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e88 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_48.m_end = pvVar24;
    msg_48.m_begin = pvVar23;
    file_48.m_end = (iterator)0x3a1;
    file_48.m_begin = (iterator)&local_e80;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_e90,
               msg_48);
    std::__cxx11::string::string
              ((string *)&expected_feerate,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &cVar19._M_node[2]._M_left);
    rVar9.super_class_property<bool>.value =
         (class_property<bool>)
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &expected_feerate,"");
    local_ea8.m_message.px = (element_type *)0x0;
    local_ea8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    aStack_300._8_8_ = &local_eb8;
    local_eb8.nSatoshisPerK = 0xc643cf;
    local_eb0 = "";
    local_310._8_8_ = local_310._8_8_ & 0xffffffffffffff00;
    local_310._0_8_ = &PTR__lazy_ostream_0113a070;
    aStack_300._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_ec8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_ec0 = "";
    plVar16 = (long *)&DAT_00000001;
    pvVar23 = (iterator)0x0;
    local_ea8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar9.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_ea8,(lazy_ostream *)local_310,1,0,WARN,(check_type)pcVar31,(size_t)&local_ec8,
               0x3a1);
    boost::detail::shared_count::~shared_count(&local_ea8.m_message.pn);
    std::__cxx11::string::~string((string *)&expected_feerate);
    local_ed8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_ed0 = "";
    local_ee8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ee0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_49.m_end = pvVar23;
    msg_49.m_begin = (iterator)plVar16;
    file_49.m_end = (iterator)0x3a3;
    file_49.m_begin = (iterator)&local_ed8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_ee8,
               msg_49);
    plVar21 = std::optional<long>::value((optional<long> *)&cVar19._M_node[5]._M_right);
    local_ea8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(*plVar21 == 100000000);
    local_ea8.m_message.px = (element_type *)0x0;
    local_ea8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    plVar21 = std::optional<long>::value((optional<long> *)&cVar19._M_node[5]._M_right);
    tinyformat::format<long,long>
              ((string *)local_310,(tinyformat *)"rich parent: expected fee %s, got %s",
               (char *)&high_parent_fee,plVar21,plVar16);
    expected_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_01139e30;
    aStack_2e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_ef8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_ef0 = "";
    ar = &local_ea8;
    pvVar23 = &DAT_00000001;
    pvVar24 = &DAT_00000001;
    aStack_2e0._8_8_ = (string *)local_310;
    boost::test_tools::tt_detail::report_assertion
              (ar,(lazy_ostream *)&expected_feerate,1,1,WARN,(check_type)pcVar31,(size_t)&local_ef8,
               0x3a3);
    std::__cxx11::string::~string((string *)local_310);
    boost::detail::shared_count::~shared_count(&local_ea8.m_message.pn);
    local_f08 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_f00 = "";
    local_f18 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f10 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_50.m_end = pvVar24;
    msg_50.m_begin = pvVar23;
    file_50.m_end = (iterator)0x3a4;
    file_50.m_begin = (iterator)&local_f08;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_f18,
               msg_50);
    iVar12 = GetVirtualTransactionSize
                       (tx_parent_rich.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    CFeeRate::CFeeRate(&local_eb8,&high_parent_fee,(uint32_t)iVar12);
    local_310[0] = (class_property<bool>)
                   (class_property<bool>)
                   (cVar19._M_node[6]._M_parent == (_Base_ptr)local_eb8.nSatoshisPerK &
                   *(byte *)&cVar19._M_node[6]._M_left);
    local_310._8_8_ = (char *)0x0;
    aStack_300._M_allocated_capacity = 0;
    local_ea8._0_8_ =
         "it_parent->second.m_effective_feerate == CFeeRate(high_parent_fee, GetVirtualTransactionSize(*tx_parent_rich))"
    ;
    local_ea8.m_message.px = (element_type *)0xc64494;
    expected_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_0113a070;
    aStack_2e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_f28 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_f20 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    aStack_2e0._8_8_ = ar;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_310,(lazy_ostream *)&expected_feerate,1,0,WARN,
               (check_type)pcVar31,(size_t)&local_f28,0x3a4);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_300._M_allocated_capacity);
    local_f38 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_f30 = "";
    local_f48 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f40 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_51.m_end = pvVar24;
    msg_51.m_begin = pvVar23;
    file_51.m_end = (iterator)0x3a5;
    file_51.m_begin = (iterator)&local_f38;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_f48,
               msg_51);
    p_Var27 = cVar20._M_node + 2;
    expected_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_01139f30;
    aStack_2e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_2e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_f58 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_f50 = "";
    local_310._0_4_ = 1;
    pvVar23 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MempoolAcceptResult::ResultType,MempoolAcceptResult::ResultType>
              (&expected_feerate,&local_f58,0x3a5,1,2,p_Var27,0xc64495,(assertion_result *)local_310
               ,0xc643a6);
    local_f68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_f60 = "";
    local_f78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f70 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_52.m_end = (iterator)p_Var27;
    msg_52.m_begin = pvVar23;
    file_52.m_end = (iterator)0x3a6;
    file_52.m_begin = (iterator)&local_f68;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_f78,
               msg_52);
    expected_feerate.nSatoshisPerK = (CAmount)&PTR__lazy_ostream_01139f30;
    aStack_2e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_2e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_f88 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_f80 = "";
    pvVar23 = local_310;
    local_310._0_4_ = *(undefined4 *)((long)&cVar20._M_node[2]._M_parent + 4);
    local_ea8._0_4_ = 10;
    pvVar24 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxValidationResult,TxValidationResult>
              (&expected_feerate,&local_f88,0x3a6,1,2,pvVar23,0xc62fdf,ar,0xc63b75);
    local_f98 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_f90 = "";
    local_fa8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_fa0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_53.m_end = pvVar23;
    msg_53.m_begin = pvVar24;
    file_53.m_end = (iterator)0x3a7;
    file_53.m_begin = (iterator)&local_f98;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_fa8,
               msg_53);
    std::__cxx11::string::string
              ((string *)&expected_feerate,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &cVar20._M_node[2]._M_left);
    bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &expected_feerate,"min relay fee not met");
    local_ea8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar10;
    local_ea8.m_message.px = (element_type *)0x0;
    local_ea8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_eb8.nSatoshisPerK = 0xc644b4;
    local_eb0 = "";
    local_310._8_8_ = local_310._8_8_ & 0xffffffffffffff00;
    local_310._0_8_ = &PTR__lazy_ostream_0113a070;
    aStack_300._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_300._8_8_ = &local_eb8;
    local_fb8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_fb0 = "";
    pvVar23 = &DAT_00000001;
    pvVar24 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_ea8,(lazy_ostream *)local_310,1,0,WARN,(check_type)ar,(size_t)&local_fb8,0x3a7
              );
    boost::detail::shared_count::~shared_count(&local_ea8.m_message.pn);
    std::__cxx11::string::~string((string *)&expected_feerate);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&expected_wtxids_1);
  expected_pool_size = expected_pool_size + 1;
  local_fc8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_fc0 = "";
  msg_54.m_end = pvVar24;
  msg_54.m_begin = pvVar23;
  file_54.m_end = (iterator)0x3aa;
  file_54.m_begin = (iterator)&local_fc8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,
             (size_t)&stack0xfffffffffffff028,msg_54);
  expected_wtxids_1.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)expected_wtxids_1.
                        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  expected_wtxids_1.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  expected_wtxids_1.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  expected_feerate.nSatoshisPerK =
       CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                        super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                        mempool._M_t.
                        super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                        super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                        super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&expected_wtxids_1,&stack0xfffffffffffff018,0x3aa,1,2,&expected_feerate,0xc629c5,
             &expected_pool_size,0xc62ea6);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&submit_cpfp_deprio);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_child_poor.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_child_poor);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_parent_rich.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_parent_rich);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_rich_parent);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_child_cheap.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_child_cheap);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_parent_cheap.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_parent_cheap);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_still_too_low);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_parent);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_cpfp);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&child_spk.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&grandchild_key.keydata);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&parent_spk.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&child_key.keydata);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock20.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_005550e9:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(package_cpfp_tests)
{
    mineBlocks(5);
    MockMempoolMinFee(CFeeRate(5000));
    LOCK(::cs_main);
    size_t expected_pool_size = m_node.mempool->size();
    CKey child_key = GenerateRandomKey();
    CScript parent_spk = GetScriptForDestination(WitnessV0KeyHash(child_key.GetPubKey()));
    CKey grandchild_key = GenerateRandomKey();
    CScript child_spk = GetScriptForDestination(WitnessV0KeyHash(grandchild_key.GetPubKey()));

    // low-fee parent and high-fee child package
    const CAmount coinbase_value{50 * COIN};
    const CAmount parent_value{coinbase_value - low_fee_amt};
    const CAmount child_value{parent_value - COIN};

    Package package_cpfp;
    auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                    /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                    /*output_destination=*/parent_spk,
                                                    /*output_amount=*/parent_value, /*submit=*/false);
    CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);
    package_cpfp.push_back(tx_parent);

    auto mtx_child = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent, /*input_vout=*/0,
                                                   /*input_height=*/101, /*input_signing_key=*/child_key,
                                                   /*output_destination=*/child_spk,
                                                   /*output_amount=*/child_value, /*submit=*/false);
    CTransactionRef tx_child = MakeTransactionRef(mtx_child);
    package_cpfp.push_back(tx_child);

    // Package feerate is calculated using modified fees, and prioritisetransaction accepts negative
    // fee deltas. This should be taken into account. De-prioritise the parent transaction
    // to bring the package feerate to 0.
    m_node.mempool->PrioritiseTransaction(tx_parent->GetHash(), child_value - coinbase_value);
    {
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
        const auto submit_cpfp_deprio = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                   package_cpfp, /*test_accept=*/ false, /*client_maxfeerate=*/{});
        if (auto err_cpfp_deprio{CheckPackageMempoolAcceptResult(package_cpfp, submit_cpfp_deprio, /*expect_valid=*/false, m_node.mempool.get())}) {
            BOOST_ERROR(err_cpfp_deprio.value());
        } else {
            BOOST_CHECK_EQUAL(submit_cpfp_deprio.m_state.GetResult(), PackageValidationResult::PCKG_TX);
            BOOST_CHECK_EQUAL(submit_cpfp_deprio.m_tx_results.find(tx_parent->GetWitnessHash())->second.m_state.GetResult(),
                              TxValidationResult::TX_MEMPOOL_POLICY);
            BOOST_CHECK_EQUAL(submit_cpfp_deprio.m_tx_results.find(tx_child->GetWitnessHash())->second.m_state.GetResult(),
                              TxValidationResult::TX_MISSING_INPUTS);
            BOOST_CHECK(submit_cpfp_deprio.m_tx_results.find(tx_parent->GetWitnessHash())->second.m_state.GetRejectReason() == "min relay fee not met");
            BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
        }
    }

    // Clear the prioritisation of the parent transaction.
    WITH_LOCK(m_node.mempool->cs, m_node.mempool->ClearPrioritisation(tx_parent->GetHash()));

    // Package CPFP: Even though the parent's feerate is below the mempool minimum feerate, the
    // child pays enough for the package feerate to meet the threshold.
    {
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
        const auto submit_cpfp = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                   package_cpfp, /*test_accept=*/ false, /*client_maxfeerate=*/{});
        if (auto err_cpfp{CheckPackageMempoolAcceptResult(package_cpfp, submit_cpfp, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_cpfp.value());
        } else {
            auto it_parent = submit_cpfp.m_tx_results.find(tx_parent->GetWitnessHash());
            auto it_child = submit_cpfp.m_tx_results.find(tx_child->GetWitnessHash());
            BOOST_CHECK(it_parent->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_parent->second.m_base_fees.value() == coinbase_value - parent_value);
            BOOST_CHECK(it_child->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_child->second.m_base_fees.value() == COIN);

            const CFeeRate expected_feerate(coinbase_value - child_value,
                                            GetVirtualTransactionSize(*tx_parent) + GetVirtualTransactionSize(*tx_child));
            BOOST_CHECK(it_parent->second.m_effective_feerate.value() == expected_feerate);
            BOOST_CHECK(it_child->second.m_effective_feerate.value() == expected_feerate);
            std::vector<Wtxid> expected_wtxids({tx_parent->GetWitnessHash(), tx_child->GetWitnessHash()});
            BOOST_CHECK(it_parent->second.m_wtxids_fee_calculations.value() == expected_wtxids);
            BOOST_CHECK(it_child->second.m_wtxids_fee_calculations.value() == expected_wtxids);
            BOOST_CHECK(expected_feerate.GetFeePerK() > 1000);
        }
        expected_pool_size += 2;
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Just because we allow low-fee parents doesn't mean we allow low-feerate packages.
    // The mempool minimum feerate is 5sat/vB, but this package just pays 800 satoshis total.
    // The child fees would be able to pay for itself, but isn't enough for the entire package.
    Package package_still_too_low;
    const CAmount parent_fee{200};
    const CAmount child_fee{600};
    auto mtx_parent_cheap = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[1], /*input_vout=*/0,
                                                          /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                          /*output_destination=*/parent_spk,
                                                          /*output_amount=*/coinbase_value - parent_fee, /*submit=*/false);
    CTransactionRef tx_parent_cheap = MakeTransactionRef(mtx_parent_cheap);
    package_still_too_low.push_back(tx_parent_cheap);
    BOOST_CHECK(m_node.mempool->GetMinFee().GetFee(GetVirtualTransactionSize(*tx_parent_cheap)) > parent_fee);
    BOOST_CHECK(m_node.mempool->m_opts.min_relay_feerate.GetFee(GetVirtualTransactionSize(*tx_parent_cheap)) <= parent_fee);

    auto mtx_child_cheap = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent_cheap, /*input_vout=*/0,
                                                         /*input_height=*/101, /*input_signing_key=*/child_key,
                                                         /*output_destination=*/child_spk,
                                                         /*output_amount=*/coinbase_value - parent_fee - child_fee, /*submit=*/false);
    CTransactionRef tx_child_cheap = MakeTransactionRef(mtx_child_cheap);
    package_still_too_low.push_back(tx_child_cheap);
    BOOST_CHECK(m_node.mempool->GetMinFee().GetFee(GetVirtualTransactionSize(*tx_child_cheap)) <= child_fee);
    BOOST_CHECK(m_node.mempool->GetMinFee().GetFee(GetVirtualTransactionSize(*tx_parent_cheap) + GetVirtualTransactionSize(*tx_child_cheap)) > parent_fee + child_fee);
    BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

    // Cheap package should fail for being too low fee.
    {
        const auto submit_package_too_low = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                   package_still_too_low, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_package_too_low{CheckPackageMempoolAcceptResult(package_still_too_low, submit_package_too_low, /*expect_valid=*/false, m_node.mempool.get())}) {
            BOOST_ERROR(err_package_too_low.value());
        } else {
            // Individual feerate of parent is too low.
            BOOST_CHECK_EQUAL(submit_package_too_low.m_tx_results.at(tx_parent_cheap->GetWitnessHash()).m_state.GetResult(),
                              TxValidationResult::TX_RECONSIDERABLE);
            BOOST_CHECK(submit_package_too_low.m_tx_results.at(tx_parent_cheap->GetWitnessHash()).m_effective_feerate.value() ==
                        CFeeRate(parent_fee, GetVirtualTransactionSize(*tx_parent_cheap)));
            // Package feerate of parent + child is too low.
            BOOST_CHECK_EQUAL(submit_package_too_low.m_tx_results.at(tx_child_cheap->GetWitnessHash()).m_state.GetResult(),
                              TxValidationResult::TX_RECONSIDERABLE);
            BOOST_CHECK(submit_package_too_low.m_tx_results.at(tx_child_cheap->GetWitnessHash()).m_effective_feerate.value() ==
                        CFeeRate(parent_fee + child_fee, GetVirtualTransactionSize(*tx_parent_cheap) + GetVirtualTransactionSize(*tx_child_cheap)));
        }
        BOOST_CHECK_EQUAL(submit_package_too_low.m_state.GetResult(), PackageValidationResult::PCKG_TX);
        BOOST_CHECK_EQUAL(submit_package_too_low.m_state.GetRejectReason(), "transaction failed");
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Package feerate includes the modified fees of the transactions.
    // This means a child with its fee delta from prioritisetransaction can pay for a parent.
    m_node.mempool->PrioritiseTransaction(tx_child_cheap->GetHash(), 1 * COIN);
    // Now that the child's fees have "increased" by 1 BTC, the cheap package should succeed.
    {
        const auto submit_prioritised_package = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                                  package_still_too_low, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_prioritised{CheckPackageMempoolAcceptResult(package_still_too_low, submit_prioritised_package, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_prioritised.value());
        } else {
            const CFeeRate expected_feerate(1 * COIN + parent_fee + child_fee,
                GetVirtualTransactionSize(*tx_parent_cheap) + GetVirtualTransactionSize(*tx_child_cheap));
            BOOST_CHECK_EQUAL(submit_prioritised_package.m_tx_results.size(), package_still_too_low.size());
            auto it_parent = submit_prioritised_package.m_tx_results.find(tx_parent_cheap->GetWitnessHash());
            auto it_child = submit_prioritised_package.m_tx_results.find(tx_child_cheap->GetWitnessHash());
            BOOST_CHECK(it_parent->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_parent->second.m_base_fees.value() == parent_fee);
            BOOST_CHECK(it_parent->second.m_effective_feerate.value() == expected_feerate);
            BOOST_CHECK(it_child->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_child->second.m_base_fees.value() == child_fee);
            BOOST_CHECK(it_child->second.m_effective_feerate.value() == expected_feerate);
            std::vector<Wtxid> expected_wtxids({tx_parent_cheap->GetWitnessHash(), tx_child_cheap->GetWitnessHash()});
            BOOST_CHECK(it_parent->second.m_wtxids_fee_calculations.value() == expected_wtxids);
            BOOST_CHECK(it_child->second.m_wtxids_fee_calculations.value() == expected_wtxids);
        }
        expected_pool_size += 2;
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Package feerate is calculated without topology in mind; it's just aggregating fees and sizes.
    // However, this should not allow parents to pay for children. Each transaction should be
    // validated individually first, eliminating sufficient-feerate parents before they are unfairly
    // included in the package feerate. It's also important that the low-fee child doesn't prevent
    // the parent from being accepted.
    Package package_rich_parent;
    const CAmount high_parent_fee{1 * COIN};
    auto mtx_parent_rich = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[2], /*input_vout=*/0,
                                                         /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                         /*output_destination=*/parent_spk,
                                                         /*output_amount=*/coinbase_value - high_parent_fee, /*submit=*/false);
    CTransactionRef tx_parent_rich = MakeTransactionRef(mtx_parent_rich);
    package_rich_parent.push_back(tx_parent_rich);

    auto mtx_child_poor = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent_rich, /*input_vout=*/0,
                                                        /*input_height=*/101, /*input_signing_key=*/child_key,
                                                        /*output_destination=*/child_spk,
                                                        /*output_amount=*/coinbase_value - high_parent_fee, /*submit=*/false);
    CTransactionRef tx_child_poor = MakeTransactionRef(mtx_child_poor);
    package_rich_parent.push_back(tx_child_poor);

    // Parent pays 1 BTC and child pays none. The parent should be accepted without the child.
    {
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
        const auto submit_rich_parent = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                          package_rich_parent, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_rich_parent{CheckPackageMempoolAcceptResult(package_rich_parent, submit_rich_parent, /*expect_valid=*/false, m_node.mempool.get())}) {
            BOOST_ERROR(err_rich_parent.value());
        } else {
            // The child would have been validated on its own and failed.
            BOOST_CHECK_EQUAL(submit_rich_parent.m_state.GetResult(), PackageValidationResult::PCKG_TX);
            BOOST_CHECK_EQUAL(submit_rich_parent.m_state.GetRejectReason(), "transaction failed");

            auto it_parent = submit_rich_parent.m_tx_results.find(tx_parent_rich->GetWitnessHash());
            auto it_child = submit_rich_parent.m_tx_results.find(tx_child_poor->GetWitnessHash());
            BOOST_CHECK(it_parent->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_child->second.m_result_type == MempoolAcceptResult::ResultType::INVALID);
            BOOST_CHECK(it_parent->second.m_state.GetRejectReason() == "");
            BOOST_CHECK_MESSAGE(it_parent->second.m_base_fees.value() == high_parent_fee,
                    strprintf("rich parent: expected fee %s, got %s", high_parent_fee, it_parent->second.m_base_fees.value()));
            BOOST_CHECK(it_parent->second.m_effective_feerate == CFeeRate(high_parent_fee, GetVirtualTransactionSize(*tx_parent_rich)));
            BOOST_CHECK_EQUAL(it_child->second.m_result_type, MempoolAcceptResult::ResultType::INVALID);
            BOOST_CHECK_EQUAL(it_child->second.m_state.GetResult(), TxValidationResult::TX_MEMPOOL_POLICY);
            BOOST_CHECK(it_child->second.m_state.GetRejectReason() == "min relay fee not met");
        }
        expected_pool_size += 1;
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }
}